

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 GenStateCompileSwitchBlock(jx9_gen_state *pGen,sxu32 *pBlockStart)

{
  sxu32 sVar1;
  int iVar2;
  bool bVar3;
  sxi32 local_24;
  sxi32 nKwrd;
  sxi32 rc;
  sxu32 *pBlockStart_local;
  jx9_gen_state *pGen_local;
  
  local_24 = 0;
  while( true ) {
    bVar3 = false;
    if (pGen->pIn < pGen->pEnd) {
      bVar3 = (pGen->pIn->nType & 0x140000) == 0;
    }
    if (!bVar3) break;
    local_24 = jx9GenCompileError(pGen,1,pGen->pIn->nLine,"Unexpected token \'%z\'",pGen->pIn);
    if (local_24 == -10) {
      return -10;
    }
    pGen->pIn = pGen->pIn + 1;
  }
  pGen->pIn = pGen->pIn + 1;
  sVar1 = jx9VmInstrLength(pGen->pVm);
  *pBlockStart = sVar1;
  do {
    if (pGen->pEnd <= pGen->pIn) {
      return local_24;
    }
    if ((pGen->pIn->nType & 4) == 0) {
      if ((pGen->pIn->nType & 0x80) != 0) {
        return -0x12;
      }
    }
    else {
      iVar2 = (int)pGen->pIn->pUserData;
      if (iVar2 == 5) {
        return 0;
      }
      if (iVar2 == 10) {
        return 0;
      }
    }
    local_24 = jx9CompileBlock(pGen);
    if (local_24 == -10) {
      return -10;
    }
  } while( true );
}

Assistant:

static sxi32 GenStateCompileSwitchBlock(jx9_gen_state *pGen,sxu32 *pBlockStart)
{
	sxi32 rc = SXRET_OK;
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI/*';'*/|JX9_TK_COLON/*':'*/)) == 0 ){
		/* Unexpected token */
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Unexpected token '%z'", &pGen->pIn->sData);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		pGen->pIn++;
	}
	pGen->pIn++;
	/* First instruction to execute in this block. */
	*pBlockStart = jx9VmInstrLength(pGen->pVm);
	/* Compile the block until we hit a case/default/endswitch keyword
	 * or the '}' token */
	for(;;){
		if( pGen->pIn >= pGen->pEnd ){
			/* No more input to process */
			break;
		}
		rc = SXRET_OK;
		if( (pGen->pIn->nType & JX9_TK_KEYWORD) == 0 ){
			if( pGen->pIn->nType & JX9_TK_CCB /*'}' */ ){
				rc = SXERR_EOF;
				break;
			}
		}else{
			sxi32 nKwrd;
			/* Extract the keyword */
			nKwrd = SX_PTR_TO_INT(pGen->pIn->pUserData);
			if( nKwrd == JX9_TKWRD_CASE || nKwrd == JX9_TKWRD_DEFAULT ){
				break;
			}
		}
		/* Compile block */
		rc = jx9CompileBlock(&(*pGen));
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
	}
	return rc;
}